

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void itrans_dct2_h8_w32_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 *puVar46;
  long in_RDI;
  undefined1 auVar47 [32];
  s16 tmp [256];
  __m128i min_val_1;
  __m128i max_val_1;
  __m128i zero;
  __m128i offset_1;
  __m128i t3_1;
  __m128i t2_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i eo1_1;
  __m128i eo0_1;
  __m128i ee1_1;
  __m128i ee0_1;
  __m128i o3_1;
  __m128i o2_1;
  __m128i o1_1;
  __m128i o0_1;
  __m128i e3_1;
  __m128i e2_1;
  __m128i e1_1;
  __m128i e0_1;
  __m128i s7_1;
  __m128i s6_1;
  __m128i s5_1;
  __m128i s4_1;
  __m128i s3_1;
  __m128i s2_1;
  __m128i s1_1;
  __m128i s0_1;
  __m128i coeff_p17_n42_1;
  __m128i coeff_p42_p17_1;
  __m128i coeff_p32_n32_1;
  __m128i coeff_p32_p32_1;
  __m128i coeff_p38_n44_1;
  __m128i coeff_p9_n25_1;
  __m128i coeff_p9_p38_1;
  __m128i coeff_p25_n44_1;
  __m128i coeff_n44_n25_1;
  __m128i coeff_p38_n9_1;
  __m128i coeff_p25_p9_1;
  __m128i coeff_p44_p38_1;
  __m256i min_val;
  __m256i max_val;
  int i_src7;
  int i_src6;
  int i_src5;
  int i_src4;
  int i_src3;
  int i_src2;
  int j;
  __m256i offset;
  __m256i d7;
  __m256i d6;
  __m256i d5;
  __m256i d4;
  __m256i d3;
  __m256i d2;
  __m256i d1;
  __m256i d0;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i eo1;
  __m256i eo0;
  __m256i ee1;
  __m256i ee0;
  __m256i o3;
  __m256i o2;
  __m256i o1;
  __m256i o0;
  __m256i e3;
  __m256i e2;
  __m256i e1;
  __m256i e0;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m256i coeff_p17_n42;
  __m256i coeff_p42_p17;
  __m256i coeff_p32_n32;
  __m256i coeff_p32_p32;
  __m256i coeff_p38_n44;
  __m256i coeff_p9_n25;
  __m256i coeff_p9_p38;
  __m256i coeff_p25_n44;
  __m256i coeff_n44_n25;
  __m256i coeff_p38_n9;
  __m256i coeff_p25_p9;
  __m256i coeff_p44_p38;
  undefined8 local_2e00 [148];
  undefined1 local_2960 [16];
  undefined1 auStackY_2950 [16];
  undefined8 local_2940;
  undefined8 uStackY_2938;
  undefined8 uStackY_2930;
  undefined8 uStackY_2928;
  int local_291c;
  int local_2918;
  int local_2914;
  int local_2910;
  int local_290c;
  int local_2908;
  int local_2904;
  undefined1 local_2900 [16];
  undefined1 auStackY_28f0 [16];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined8 local_25a0;
  undefined8 uStackY_2598;
  undefined8 local_2590;
  undefined8 uStackY_2588;
  undefined8 local_2580;
  undefined8 uStackY_2578;
  undefined8 local_2570;
  undefined8 uStackY_2568;
  undefined8 local_2560;
  undefined8 uStackY_2558;
  undefined8 local_2550;
  undefined8 uStackY_2548;
  undefined8 local_2540;
  undefined8 uStackY_2538;
  undefined8 local_2530;
  undefined8 uStackY_2528;
  undefined8 local_2520;
  undefined8 uStackY_2518;
  undefined8 uStackY_2510;
  undefined8 uStackY_2508;
  undefined8 local_2500;
  undefined8 uStackY_24f8;
  undefined8 uStackY_24f0;
  undefined8 uStackY_24e8;
  undefined8 local_24e0;
  undefined8 uStackY_24d8;
  undefined8 uStackY_24d0;
  undefined8 uStackY_24c8;
  undefined8 local_24c0;
  undefined8 uStackY_24b8;
  undefined8 uStackY_24b0;
  undefined8 uStackY_24a8;
  undefined8 local_24a0;
  undefined8 uStackY_2498;
  undefined8 uStackY_2490;
  undefined8 uStackY_2488;
  undefined8 local_2480;
  undefined8 uStackY_2478;
  undefined8 uStackY_2470;
  undefined8 uStackY_2468;
  undefined8 local_2460;
  undefined8 uStackY_2458;
  undefined8 uStackY_2450;
  undefined8 uStackY_2448;
  undefined8 local_2440;
  undefined8 uStackY_2438;
  undefined8 uStackY_2430;
  undefined8 uStackY_2428;
  undefined8 local_2420;
  undefined8 uStackY_2418;
  undefined8 uStackY_2410;
  undefined8 uStackY_2408;
  undefined8 local_2400;
  undefined8 uStackY_23f8;
  undefined8 uStackY_23f0;
  undefined8 uStackY_23e8;
  undefined8 local_23e0;
  undefined8 uStackY_23d8;
  undefined8 uStackY_23d0;
  undefined8 uStackY_23c8;
  undefined8 local_23c0;
  undefined8 uStackY_23b8;
  undefined8 uStackY_23b0;
  undefined8 uStackY_23a8;
  int local_239c;
  uint local_2398;
  int local_2394;
  undefined8 *local_2390;
  int local_2384;
  long local_2380;
  undefined4 local_2374;
  undefined4 local_2370;
  undefined4 local_236c;
  undefined4 local_2368;
  undefined4 local_2364;
  undefined4 local_2360;
  undefined4 local_235c;
  undefined4 local_2358;
  undefined4 local_2354;
  undefined4 local_2350;
  undefined4 local_234c;
  undefined4 local_2348;
  undefined4 local_2344;
  undefined1 (*local_2340) [16];
  undefined1 (*local_2338) [16];
  undefined1 (*local_2330) [16];
  undefined1 (*local_2328) [16];
  undefined1 (*local_2320) [16];
  undefined1 (*local_2318) [16];
  undefined1 (*local_2310) [16];
  undefined1 (*local_2308) [16];
  undefined8 local_2180;
  undefined8 uStackY_2178;
  undefined8 local_2170;
  undefined8 uStackY_2168;
  undefined8 local_2160;
  undefined8 uStackY_2158;
  undefined8 local_2150;
  undefined8 uStackY_2148;
  undefined8 local_2140;
  undefined8 uStackY_2138;
  undefined8 local_2130;
  undefined8 uStackY_2128;
  undefined8 local_2120;
  undefined8 uStackY_2118;
  undefined8 local_2110;
  undefined8 uStackY_2108;
  undefined8 local_2080;
  undefined8 uStackY_2078;
  undefined8 local_2070;
  undefined8 uStackY_2068;
  undefined8 local_2060;
  undefined8 uStackY_2058;
  undefined8 local_2050;
  undefined8 uStackY_2048;
  undefined8 local_2040;
  undefined8 uStackY_2038;
  undefined8 local_2030;
  undefined8 uStackY_2028;
  undefined8 local_2020;
  undefined8 uStackY_2018;
  undefined8 local_2010;
  undefined8 uStackY_2008;
  undefined8 local_2000;
  undefined8 uStackY_1ff8;
  undefined8 local_1ff0;
  undefined8 uStackY_1fe8;
  undefined8 local_1fe0;
  undefined8 uStackY_1fd8;
  undefined8 local_1fd0;
  undefined8 uStackY_1fc8;
  undefined8 local_1fc0;
  undefined8 uStackY_1fb8;
  undefined8 uStackY_1fb0;
  undefined8 uStackY_1fa8;
  undefined8 local_1fa0;
  undefined8 uStackY_1f98;
  undefined8 uStackY_1f90;
  undefined8 uStackY_1f88;
  undefined8 local_1f80;
  undefined8 uStackY_1f78;
  undefined8 uStackY_1f70;
  undefined8 uStackY_1f68;
  undefined8 local_1f60;
  undefined8 uStackY_1f58;
  undefined8 uStackY_1f50;
  undefined8 uStackY_1f48;
  undefined8 local_1f40;
  undefined8 uStackY_1f38;
  undefined8 uStackY_1f30;
  undefined8 uStackY_1f28;
  undefined8 local_1f20;
  undefined8 uStackY_1f18;
  undefined8 uStackY_1f10;
  undefined8 uStackY_1f08;
  undefined8 local_1f00;
  undefined8 uStackY_1ef8;
  undefined8 uStackY_1ef0;
  undefined8 uStackY_1ee8;
  undefined8 local_1ee0;
  undefined8 uStackY_1ed8;
  undefined8 uStackY_1ed0;
  undefined8 uStackY_1ec8;
  undefined8 local_1ec0;
  undefined8 uStackY_1eb8;
  undefined8 uStackY_1eb0;
  undefined8 uStackY_1ea8;
  undefined8 local_1ea0;
  undefined8 uStackY_1e98;
  undefined8 uStackY_1e90;
  undefined8 uStackY_1e88;
  undefined8 local_1e80;
  undefined8 uStackY_1e78;
  undefined8 uStackY_1e70;
  undefined8 uStackY_1e68;
  undefined8 local_1e60;
  undefined8 uStackY_1e58;
  undefined8 uStackY_1e50;
  undefined8 uStackY_1e48;
  undefined8 local_1e40;
  undefined8 uStackY_1e38;
  undefined8 uStackY_1e30;
  undefined8 uStackY_1e28;
  undefined8 local_1e20;
  undefined8 uStackY_1e18;
  undefined8 uStackY_1e10;
  undefined8 uStackY_1e08;
  undefined8 local_1e00;
  undefined8 uStackY_1df8;
  undefined8 uStackY_1df0;
  undefined8 uStackY_1de8;
  undefined8 local_1de0;
  undefined8 uStackY_1dd8;
  undefined8 uStackY_1dd0;
  undefined8 uStackY_1dc8;
  undefined8 local_1dc0;
  undefined8 uStackY_1db8;
  undefined8 uStackY_1db0;
  undefined8 uStackY_1da8;
  undefined8 local_1da0;
  undefined8 uStackY_1d98;
  undefined8 uStackY_1d90;
  undefined8 uStackY_1d88;
  undefined8 local_1d80;
  undefined8 uStackY_1d78;
  undefined8 uStackY_1d70;
  undefined8 uStackY_1d68;
  undefined8 local_1d60;
  undefined8 uStackY_1d58;
  undefined8 uStackY_1d50;
  undefined8 uStackY_1d48;
  undefined8 local_1d40;
  undefined8 uStackY_1d38;
  undefined8 uStackY_1d30;
  undefined8 uStackY_1d28;
  undefined8 local_1d20;
  undefined8 uStackY_1d18;
  undefined8 uStackY_1d10;
  undefined8 uStackY_1d08;
  undefined8 local_1d00;
  undefined8 uStackY_1cf8;
  undefined8 uStackY_1cf0;
  undefined8 uStackY_1ce8;
  undefined8 local_1ce0;
  undefined8 uStackY_1cd8;
  undefined8 uStackY_1cd0;
  undefined8 uStackY_1cc8;
  undefined8 local_1cc0;
  undefined8 uStackY_1cb8;
  undefined8 uStackY_1cb0;
  undefined8 uStackY_1ca8;
  undefined8 local_1ca0;
  undefined8 uStackY_1c98;
  undefined8 uStackY_1c90;
  undefined8 uStackY_1c88;
  undefined8 local_1c80;
  undefined8 uStackY_1c78;
  undefined8 uStackY_1c70;
  undefined8 uStackY_1c68;
  undefined8 local_1c60;
  undefined8 uStackY_1c58;
  undefined8 uStackY_1c50;
  undefined8 uStackY_1c48;
  undefined8 local_1c40;
  undefined8 uStackY_1c38;
  undefined8 uStackY_1c30;
  undefined8 uStackY_1c28;
  undefined8 local_1c20;
  undefined8 uStackY_1c18;
  undefined8 uStackY_1c10;
  undefined8 uStackY_1c08;
  undefined8 local_1c00;
  undefined8 uStackY_1bf8;
  undefined8 uStackY_1bf0;
  undefined8 uStackY_1be8;
  undefined8 local_1be0;
  undefined8 uStackY_1bd8;
  undefined8 uStackY_1bd0;
  undefined8 uStackY_1bc8;
  undefined1 local_1bc0 [16];
  undefined1 auStackY_1bb0 [16];
  undefined8 local_1ba0;
  undefined8 uStackY_1b98;
  undefined8 uStackY_1b90;
  undefined8 uStackY_1b88;
  undefined1 local_1b80 [16];
  undefined1 auStackY_1b70 [16];
  undefined8 local_1b60;
  undefined8 uStackY_1b58;
  undefined8 uStackY_1b50;
  undefined8 uStackY_1b48;
  undefined1 local_1b40 [16];
  undefined1 auStackY_1b30 [16];
  undefined8 local_1b20;
  undefined8 uStackY_1b18;
  undefined8 uStackY_1b10;
  undefined8 uStackY_1b08;
  undefined1 local_1b00 [16];
  undefined1 auStackY_1af0 [16];
  undefined8 local_1ae0;
  undefined8 uStackY_1ad8;
  undefined8 uStackY_1ad0;
  undefined8 uStackY_1ac8;
  undefined8 local_1ac0;
  undefined8 uStackY_1ab8;
  undefined8 uStackY_1ab0;
  undefined8 uStackY_1aa8;
  undefined8 local_1aa0;
  undefined8 uStackY_1a98;
  undefined8 uStackY_1a90;
  undefined8 uStackY_1a88;
  undefined8 local_1a80;
  undefined8 uStackY_1a78;
  undefined8 uStackY_1a70;
  undefined8 uStackY_1a68;
  undefined8 local_1a60;
  undefined8 uStackY_1a58;
  undefined8 uStackY_1a50;
  undefined8 uStackY_1a48;
  undefined8 local_1a40;
  undefined8 uStackY_1a38;
  undefined8 uStackY_1a30;
  undefined8 uStackY_1a28;
  undefined8 local_1a20;
  undefined8 uStackY_1a18;
  undefined8 uStackY_1a10;
  undefined8 uStackY_1a08;
  undefined8 local_1a00;
  undefined8 uStackY_19f8;
  undefined8 uStackY_19f0;
  undefined8 uStackY_19e8;
  undefined8 local_19e0;
  undefined8 uStackY_19d8;
  undefined8 uStackY_19d0;
  undefined8 uStackY_19c8;
  undefined8 local_19c0;
  undefined8 uStackY_19b8;
  undefined8 uStackY_19b0;
  undefined8 uStackY_19a8;
  undefined8 local_19a0;
  undefined8 uStackY_1998;
  undefined8 uStackY_1990;
  undefined8 uStackY_1988;
  undefined8 local_1980;
  undefined8 uStackY_1978;
  undefined8 uStackY_1970;
  undefined8 uStackY_1968;
  undefined8 local_1960;
  undefined8 uStackY_1958;
  undefined8 uStackY_1950;
  undefined8 uStackY_1948;
  undefined8 local_1940;
  undefined8 uStackY_1938;
  undefined8 uStackY_1930;
  undefined8 uStackY_1928;
  undefined8 local_1920;
  undefined8 uStackY_1918;
  undefined8 uStackY_1910;
  undefined8 uStackY_1908;
  undefined8 local_1900;
  undefined8 uStackY_18f8;
  undefined8 uStackY_18f0;
  undefined8 uStackY_18e8;
  undefined8 local_18e0;
  undefined8 uStackY_18d8;
  undefined8 uStackY_18d0;
  undefined8 uStackY_18c8;
  undefined8 local_18c0;
  undefined8 uStackY_18b8;
  undefined8 uStackY_18b0;
  undefined8 uStackY_18a8;
  undefined8 local_18a0;
  undefined8 uStackY_1898;
  undefined8 uStackY_1890;
  undefined8 uStackY_1888;
  undefined8 local_1880;
  undefined8 uStackY_1878;
  undefined8 uStackY_1870;
  undefined8 uStackY_1868;
  undefined8 local_1860;
  undefined8 uStackY_1858;
  undefined8 uStackY_1850;
  undefined8 uStackY_1848;
  undefined8 local_1840;
  undefined8 uStackY_1838;
  undefined8 uStackY_1830;
  undefined8 uStackY_1828;
  undefined8 local_1820;
  undefined8 uStackY_1818;
  undefined8 uStackY_1810;
  undefined8 uStackY_1808;
  undefined8 local_1800;
  undefined8 uStackY_17f8;
  undefined8 uStackY_17f0;
  undefined8 uStackY_17e8;
  undefined8 local_17e0;
  undefined8 uStackY_17d8;
  undefined8 uStackY_17d0;
  undefined8 uStackY_17c8;
  uint local_17a4;
  undefined8 local_17a0;
  undefined8 uStackY_1798;
  undefined8 uStackY_1790;
  undefined8 uStackY_1788;
  uint local_1764;
  undefined8 local_1760;
  undefined8 uStackY_1758;
  undefined8 uStackY_1750;
  undefined8 uStackY_1748;
  uint local_1724;
  undefined8 local_1720;
  undefined8 uStackY_1718;
  undefined8 uStackY_1710;
  undefined8 uStackY_1708;
  uint local_16e4;
  undefined8 local_16e0;
  undefined8 uStackY_16d8;
  undefined8 uStackY_16d0;
  undefined8 uStackY_16c8;
  uint local_16a4;
  undefined8 local_16a0;
  undefined8 uStackY_1698;
  undefined8 uStackY_1690;
  undefined8 uStackY_1688;
  uint local_1664;
  undefined8 local_1660;
  undefined8 uStackY_1658;
  undefined8 uStackY_1650;
  undefined8 uStackY_1648;
  uint local_1624;
  undefined8 local_1620;
  undefined8 uStackY_1618;
  undefined8 uStackY_1610;
  undefined8 uStackY_1608;
  uint local_15e4;
  undefined8 local_15e0;
  undefined8 uStackY_15d8;
  undefined8 uStackY_15d0;
  undefined8 uStackY_15c8;
  undefined8 local_15c0;
  undefined8 uStackY_15b8;
  undefined8 uStackY_15b0;
  undefined8 uStackY_15a8;
  undefined8 local_15a0;
  undefined8 uStackY_1598;
  undefined8 uStackY_1590;
  undefined8 uStackY_1588;
  undefined8 local_1580;
  undefined8 uStackY_1578;
  undefined8 uStackY_1570;
  undefined8 uStackY_1568;
  undefined8 local_1560;
  undefined8 uStackY_1558;
  undefined8 uStackY_1550;
  undefined8 uStackY_1548;
  undefined8 local_1540;
  undefined8 uStackY_1538;
  undefined8 uStackY_1530;
  undefined8 uStackY_1528;
  undefined8 local_1520;
  undefined8 uStackY_1518;
  undefined8 uStackY_1510;
  undefined8 uStackY_1508;
  undefined8 local_1500;
  undefined8 uStackY_14f8;
  undefined8 uStackY_14f0;
  undefined8 uStackY_14e8;
  undefined8 local_14e0;
  undefined8 uStackY_14d8;
  undefined8 uStackY_14d0;
  undefined8 uStackY_14c8;
  undefined8 local_14c0;
  undefined8 uStackY_14b8;
  undefined8 uStackY_14b0;
  undefined8 uStackY_14a8;
  undefined8 local_14a0;
  undefined8 uStackY_1498;
  undefined8 uStackY_1490;
  undefined8 uStackY_1488;
  undefined8 local_1480;
  undefined8 uStackY_1478;
  undefined8 uStackY_1470;
  undefined8 uStackY_1468;
  undefined8 local_1460;
  undefined8 uStackY_1458;
  undefined8 uStackY_1450;
  undefined8 uStackY_1448;
  undefined8 local_1440;
  undefined8 uStackY_1438;
  undefined8 uStackY_1430;
  undefined8 uStackY_1428;
  undefined8 local_1420;
  undefined8 uStackY_1418;
  undefined8 uStackY_1410;
  undefined8 uStackY_1408;
  undefined8 local_1400;
  undefined8 uStackY_13f8;
  undefined8 uStackY_13f0;
  undefined8 uStackY_13e8;
  undefined8 local_13e0;
  undefined8 uStackY_13d8;
  undefined8 uStackY_13d0;
  undefined8 uStackY_13c8;
  undefined8 local_13c0;
  undefined8 uStackY_13b8;
  undefined8 uStackY_13b0;
  undefined8 uStackY_13a8;
  undefined8 local_13a0;
  undefined8 uStackY_1398;
  undefined8 uStackY_1390;
  undefined8 uStackY_1388;
  undefined8 local_1380;
  undefined8 uStackY_1378;
  undefined8 uStackY_1370;
  undefined8 uStackY_1368;
  undefined8 local_1360;
  undefined8 uStackY_1358;
  undefined8 uStackY_1350;
  undefined8 uStackY_1348;
  undefined8 local_1340;
  undefined8 uStackY_1338;
  undefined8 uStackY_1330;
  undefined8 uStackY_1328;
  undefined8 local_1320;
  undefined8 uStackY_1318;
  undefined8 uStackY_1310;
  undefined8 uStackY_1308;
  undefined8 local_1300;
  undefined8 uStackY_12f8;
  undefined8 uStackY_12f0;
  undefined8 uStackY_12e8;
  undefined8 local_12e0;
  undefined8 uStackY_12d8;
  undefined8 uStackY_12d0;
  undefined8 uStackY_12c8;
  undefined8 local_12c0;
  undefined8 uStackY_12b8;
  undefined8 uStackY_12b0;
  undefined8 uStackY_12a8;
  undefined8 local_12a0;
  undefined8 uStackY_1298;
  undefined8 uStackY_1290;
  undefined8 uStackY_1288;
  undefined8 local_1280;
  undefined8 uStackY_1278;
  undefined8 uStackY_1270;
  undefined8 uStackY_1268;
  undefined8 local_1260;
  undefined8 uStackY_1258;
  undefined8 uStackY_1250;
  undefined8 uStackY_1248;
  undefined8 local_1240;
  undefined8 uStackY_1238;
  undefined8 uStackY_1230;
  undefined8 uStackY_1228;
  undefined8 local_1220;
  undefined8 uStackY_1218;
  undefined8 uStackY_1210;
  undefined8 uStackY_1208;
  undefined8 local_1200;
  undefined8 uStackY_11f8;
  undefined8 uStackY_11f0;
  undefined8 uStackY_11e8;
  undefined8 local_11e0;
  undefined8 uStackY_11d8;
  undefined8 uStackY_11d0;
  undefined8 uStackY_11c8;
  ushort local_11a4;
  ushort local_11a2;
  undefined8 local_11a0;
  undefined8 uStackY_1198;
  undefined8 uStackY_1190;
  undefined8 uStackY_1188;
  undefined8 local_1180;
  undefined8 uStackY_1178;
  undefined8 uStackY_1170;
  undefined8 uStackY_1168;
  undefined8 local_1160;
  undefined8 uStackY_1158;
  undefined8 uStackY_1150;
  undefined8 uStackY_1148;
  undefined8 local_1140;
  undefined8 uStackY_1138;
  undefined8 uStackY_1130;
  undefined8 uStackY_1128;
  undefined8 local_1120;
  undefined8 uStackY_1118;
  undefined8 uStackY_1110;
  undefined8 uStackY_1108;
  undefined8 local_1100;
  undefined8 uStackY_10f8;
  undefined8 uStackY_10f0;
  undefined8 uStackY_10e8;
  undefined8 local_10e0;
  undefined8 uStackY_10d8;
  undefined8 uStackY_10d0;
  undefined8 uStackY_10c8;
  undefined8 local_10c0;
  undefined8 uStackY_10b8;
  undefined8 uStackY_10b0;
  undefined8 uStackY_10a8;
  undefined1 local_10a0 [16];
  undefined1 auStackY_1090 [16];
  undefined8 local_1080;
  undefined8 uStackY_1078;
  undefined8 uStackY_1070;
  undefined8 uStackY_1068;
  undefined1 local_1060 [16];
  undefined1 auStackY_1050 [16];
  undefined8 local_1040;
  undefined8 uStackY_1038;
  undefined8 uStackY_1030;
  undefined8 uStackY_1028;
  undefined1 local_1020 [16];
  undefined1 auStackY_1010 [16];
  undefined8 local_1000;
  undefined8 uStackY_ff8;
  undefined8 uStackY_ff0;
  undefined8 uStackY_fe8;
  undefined1 local_fe0 [16];
  undefined1 auStackY_fd0 [16];
  undefined8 local_fc0;
  undefined8 uStackY_fb8;
  undefined8 uStackY_fb0;
  undefined8 uStackY_fa8;
  undefined8 local_fa0;
  undefined8 uStackY_f98;
  undefined8 uStackY_f90;
  undefined8 uStackY_f88;
  undefined8 *local_f68;
  undefined8 local_f60;
  undefined8 uStackY_f58;
  undefined8 uStackY_f50;
  undefined8 uStackY_f48;
  undefined8 *local_f28;
  undefined8 local_f20;
  undefined8 uStackY_f18;
  undefined8 uStackY_f10;
  undefined8 uStackY_f08;
  undefined8 *local_ee8;
  undefined8 local_ee0;
  undefined8 uStackY_ed8;
  undefined8 uStackY_ed0;
  undefined8 uStackY_ec8;
  undefined8 *local_ea8;
  undefined1 local_ea0 [32];
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined4 local_e6c;
  undefined4 local_e68;
  undefined4 local_e64;
  undefined1 local_e60 [16];
  undefined1 auStackY_e50 [16];
  undefined4 local_e40;
  undefined4 local_e3c;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 local_e30;
  undefined4 local_e2c;
  undefined4 local_e28;
  undefined4 local_e24;
  undefined1 local_e20 [16];
  undefined1 auStackY_e10 [16];
  undefined4 local_e00;
  undefined4 local_dfc;
  undefined4 local_df8;
  undefined4 local_df4;
  undefined4 local_df0;
  undefined4 local_dec;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined1 local_de0 [16];
  undefined1 auStackY_dd0 [16];
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined4 local_dac;
  undefined4 local_da8;
  undefined4 local_da4;
  undefined1 local_da0 [16];
  undefined1 auStackY_d90 [16];
  undefined4 local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined4 local_d74;
  undefined4 local_d70;
  undefined4 local_d6c;
  undefined4 local_d68;
  undefined4 local_d64;
  undefined1 local_d60 [16];
  undefined1 auStackY_d50 [16];
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  undefined4 local_d2c;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined1 local_d20 [16];
  undefined1 auStackY_d10 [16];
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined1 local_ce0 [16];
  undefined1 auStackY_cd0 [16];
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined4 local_ca4;
  undefined1 local_ca0 [16];
  undefined1 auStackY_c90 [16];
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  undefined4 local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined1 local_c60 [16];
  undefined1 auStackY_c50 [16];
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined1 local_c20 [16];
  undefined1 auStackY_c10 [16];
  undefined4 local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined4 local_be8;
  undefined4 local_be4;
  undefined1 local_be0 [16];
  undefined1 auStackY_bd0 [16];
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined1 local_ba0 [16];
  undefined1 auStackY_b90 [16];
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined1 local_b60 [32];
  ushort local_b40;
  ushort local_b3e;
  ushort local_b3c;
  ushort local_b3a;
  ushort local_b38;
  ushort local_b36;
  ushort local_b34;
  ushort local_b32;
  ushort local_b30;
  ushort local_b2e;
  ushort local_b2c;
  ushort local_b2a;
  ushort local_b28;
  ushort local_b26;
  ushort local_b24;
  ushort local_b22;
  undefined1 local_b20 [16];
  undefined1 auStackY_b10 [16];
  ushort local_b00;
  ushort local_afe;
  ushort local_afc;
  ushort local_afa;
  ushort local_af8;
  ushort local_af6;
  ushort local_af4;
  ushort local_af2;
  ushort local_af0;
  ushort local_aee;
  ushort local_aec;
  ushort local_aea;
  ushort local_ae8;
  ushort local_ae6;
  ushort local_ae4;
  ushort local_ae2;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  s16 *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  s16 *in_stack_ffffffffffffffe0;
  
  auVar47._24_8_ = auStackY_2950._8_8_;
  auVar47._16_8_ = auStackY_2950._0_8_;
  auVar47._8_8_ = local_2960._8_8_;
  auVar47._0_8_ = local_2960._0_8_;
  local_2390 = local_2e00;
  local_2384 = 0x20;
  local_2394 = 0x20;
  local_2398 = 5;
  local_239c = 0xf;
  local_2344 = 0x26002c;
  auVar1 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar1 = vpinsrd_avx(auVar1,0x26002c,2);
  local_ba0 = vpinsrd_avx(auVar1,0x26002c,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar1 = vpinsrd_avx(auVar1,0x26002c,2);
  auStackY_b90 = vpinsrd_avx(auVar1,0x26002c,3);
  local_23c0 = local_ba0._0_8_;
  uStackY_23b8 = local_ba0._8_8_;
  uStackY_23b0 = auStackY_b90._0_8_;
  uStackY_23a8 = auStackY_b90._8_8_;
  local_2348 = 0x90019;
  auVar1 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar1 = vpinsrd_avx(auVar1,0x90019,2);
  local_be0 = vpinsrd_avx(auVar1,0x90019,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar1 = vpinsrd_avx(auVar1,0x90019,2);
  auStackY_bd0 = vpinsrd_avx(auVar1,0x90019,3);
  local_23e0 = local_be0._0_8_;
  uStackY_23d8 = local_be0._8_8_;
  uStackY_23d0 = auStackY_bd0._0_8_;
  uStackY_23c8 = auStackY_bd0._8_8_;
  local_234c = 0xfff70026;
  auVar1 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar1 = vpinsrd_avx(auVar1,0xfff70026,2);
  local_c20 = vpinsrd_avx(auVar1,0xfff70026,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar1 = vpinsrd_avx(auVar1,0xfff70026,2);
  auStackY_c10 = vpinsrd_avx(auVar1,0xfff70026,3);
  local_2400 = local_c20._0_8_;
  uStackY_23f8 = local_c20._8_8_;
  uStackY_23f0 = auStackY_c10._0_8_;
  uStackY_23e8 = auStackY_c10._8_8_;
  local_2350 = 0xffe7ffd4;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe7ffd4,2);
  local_c60 = vpinsrd_avx(auVar1,0xffe7ffd4,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe7ffd4,2);
  auStackY_c50 = vpinsrd_avx(auVar1,0xffe7ffd4,3);
  local_2420 = local_c60._0_8_;
  uStackY_2418 = local_c60._8_8_;
  uStackY_2410 = auStackY_c50._0_8_;
  uStackY_2408 = auStackY_c50._8_8_;
  local_2354 = 0xffd40019;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd40019,2);
  local_ca0 = vpinsrd_avx(auVar1,0xffd40019,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd40019,2);
  auStackY_c90 = vpinsrd_avx(auVar1,0xffd40019,3);
  local_2440 = local_ca0._0_8_;
  uStackY_2438 = local_ca0._8_8_;
  uStackY_2430 = auStackY_c90._0_8_;
  uStackY_2428 = auStackY_c90._8_8_;
  local_2358 = 0x260009;
  auVar1 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar1 = vpinsrd_avx(auVar1,0x260009,2);
  local_ce0 = vpinsrd_avx(auVar1,0x260009,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar1 = vpinsrd_avx(auVar1,0x260009,2);
  auStackY_cd0 = vpinsrd_avx(auVar1,0x260009,3);
  local_2460 = local_ce0._0_8_;
  uStackY_2458 = local_ce0._8_8_;
  uStackY_2450 = auStackY_cd0._0_8_;
  uStackY_2448 = auStackY_cd0._8_8_;
  local_235c = 0xffe70009;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe70009,2);
  local_d20 = vpinsrd_avx(auVar1,0xffe70009,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe70009,2);
  auStackY_d10 = vpinsrd_avx(auVar1,0xffe70009,3);
  local_2480 = local_d20._0_8_;
  uStackY_2478 = local_d20._8_8_;
  uStackY_2470 = auStackY_d10._0_8_;
  uStackY_2468 = auStackY_d10._8_8_;
  local_2360 = 0xffd40026;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd40026,2);
  local_d60 = vpinsrd_avx(auVar1,0xffd40026,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd40026,2);
  auStackY_d50 = vpinsrd_avx(auVar1,0xffd40026,3);
  local_24a0 = local_d60._0_8_;
  uStackY_2498 = local_d60._8_8_;
  uStackY_2490 = auStackY_d50._0_8_;
  uStackY_2488 = auStackY_d50._8_8_;
  local_2364 = 0x200020;
  auVar1 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar1 = vpinsrd_avx(auVar1,0x200020,2);
  local_da0 = vpinsrd_avx(auVar1,0x200020,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar1 = vpinsrd_avx(auVar1,0x200020,2);
  auStackY_d90 = vpinsrd_avx(auVar1,0x200020,3);
  local_24c0 = local_da0._0_8_;
  uStackY_24b8 = local_da0._8_8_;
  uStackY_24b0 = auStackY_d90._0_8_;
  uStackY_24a8 = auStackY_d90._8_8_;
  local_2368 = 0xffe00020;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe00020,2);
  local_de0 = vpinsrd_avx(auVar1,0xffe00020,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe00020,2);
  auStackY_dd0 = vpinsrd_avx(auVar1,0xffe00020,3);
  local_24e0 = local_de0._0_8_;
  uStackY_24d8 = local_de0._8_8_;
  uStackY_24d0 = auStackY_dd0._0_8_;
  uStackY_24c8 = auStackY_dd0._8_8_;
  local_236c = 0x11002a;
  auVar1 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,2);
  local_e20 = vpinsrd_avx(auVar1,0x11002a,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,2);
  auStackY_e10 = vpinsrd_avx(auVar1,0x11002a,3);
  local_2500 = local_e20._0_8_;
  uStackY_24f8 = local_e20._8_8_;
  uStackY_24f0 = auStackY_e10._0_8_;
  uStackY_24e8 = auStackY_e10._8_8_;
  local_2370 = 0xffd60011;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd60011,2);
  local_e60 = vpinsrd_avx(auVar1,0xffd60011,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd60011,2);
  auStackY_e50 = vpinsrd_avx(auVar1,0xffd60011,3);
  local_2520 = local_e60._0_8_;
  uStackY_2518 = local_e60._8_8_;
  uStackY_2510 = auStackY_e50._0_8_;
  uStackY_2508 = auStackY_e50._8_8_;
  local_2374 = 0x10;
  auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar1 = vpinsrd_avx(auVar1,0x10,2);
  auVar1 = vpinsrd_avx(auVar1,0x10,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  local_ea0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_ea0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_2908 = 0x40;
  local_290c = 0x60;
  local_2910 = 0x80;
  local_2914 = 0xa0;
  local_2918 = 0xc0;
  local_291c = 0xe0;
  local_2904 = 0;
  local_2380 = in_RDI;
  auVar1 = local_ea0._0_16_;
  auVar2 = local_ea0._16_16_;
  while( true ) {
    auVar42 = auVar2;
    auVar41 = auVar1;
    puVar46 = local_2390;
    auStackY_28f0._8_8_ = auVar42._8_8_;
    auStackY_28f0._0_8_ = auVar42._0_8_;
    local_2900 = auVar41;
    auStackY_28f0 = auVar42;
    if (local_2394 <= local_2904) break;
    local_2308 = (undefined1 (*) [16])(local_2380 + (long)local_2384 * 2 + (long)local_2904 * 2);
    local_2540 = *(undefined8 *)*local_2308;
    uStackY_2538 = *(undefined8 *)(*local_2308 + 8);
    local_2310 = (undefined1 (*) [16])(local_2380 + (long)local_290c * 2 + (long)local_2904 * 2);
    local_2560 = *(undefined8 *)*local_2310;
    uStackY_2558 = *(undefined8 *)(*local_2310 + 8);
    local_2318 = (undefined1 (*) [16])(local_2380 + (long)local_2914 * 2 + (long)local_2904 * 2);
    local_2580 = *(undefined8 *)*local_2318;
    uStackY_2578 = *(undefined8 *)(*local_2318 + 8);
    local_2320 = (undefined1 (*) [16])(local_2380 + (long)local_291c * 2 + (long)local_2904 * 2);
    local_25a0 = *(undefined8 *)*local_2320;
    uStackY_2598 = *(undefined8 *)(*local_2320 + 8);
    auVar3 = vpunpcklwd_avx(*local_2308,*local_2310);
    auVar1 = vpunpckhwd_avx(*local_2308,*local_2310);
    auVar4 = vpunpcklwd_avx(*local_2318,*local_2320);
    auVar2 = vpunpckhwd_avx(*local_2318,*local_2320);
    local_25b0._0_8_ = auVar3._0_8_;
    local_25b0._8_8_ = auVar3._8_8_;
    local_1fd0 = local_25b0._0_8_;
    uStackY_1fc8 = local_25b0._8_8_;
    local_25c0._0_8_ = auVar1._0_8_;
    local_25c0._8_8_ = auVar1._8_8_;
    local_25d0._0_8_ = auVar4._0_8_;
    local_25d0._8_8_ = auVar4._8_8_;
    local_1fe0 = local_25d0._0_8_;
    uStackY_1fd8 = local_25d0._8_8_;
    local_25e0._0_8_ = auVar2._0_8_;
    local_25e0._8_8_ = auVar2._8_8_;
    local_1ce0 = local_25b0._0_8_;
    uStackY_1cd8 = local_25b0._8_8_;
    uStackY_1cd0 = local_25c0._0_8_;
    uStackY_1cc8 = local_25c0._8_8_;
    local_1d00 = local_23c0;
    uStackY_1cf8 = uStackY_23b8;
    uStackY_1cf0 = uStackY_23b0;
    uStackY_1ce8 = uStackY_23a8;
    auVar28._16_8_ = local_25c0._0_8_;
    auVar28._0_16_ = auVar3;
    auVar28._24_8_ = local_25c0._8_8_;
    auVar27._8_8_ = uStackY_23b8;
    auVar27._0_8_ = local_23c0;
    auVar27._16_8_ = uStackY_23b0;
    auVar27._24_8_ = uStackY_23a8;
    auVar5 = vpmaddwd_avx2(auVar28,auVar27);
    local_1d20 = local_25d0._0_8_;
    uStackY_1d18 = local_25d0._8_8_;
    uStackY_1d10 = local_25e0._0_8_;
    uStackY_1d08 = local_25e0._8_8_;
    local_1d40 = local_23e0;
    uStackY_1d38 = uStackY_23d8;
    uStackY_1d30 = uStackY_23d0;
    uStackY_1d28 = uStackY_23c8;
    auVar26._16_8_ = local_25e0._0_8_;
    auVar26._0_16_ = auVar4;
    auVar26._24_8_ = local_25e0._8_8_;
    auVar25._8_8_ = uStackY_23d8;
    auVar25._0_8_ = local_23e0;
    auVar25._16_8_ = uStackY_23d0;
    auVar25._24_8_ = uStackY_23c8;
    auVar6 = vpmaddwd_avx2(auVar26,auVar25);
    local_1d60 = local_25b0._0_8_;
    uStackY_1d58 = local_25b0._8_8_;
    uStackY_1d50 = local_25c0._0_8_;
    uStackY_1d48 = local_25c0._8_8_;
    local_1d80 = local_2400;
    uStackY_1d78 = uStackY_23f8;
    uStackY_1d70 = uStackY_23f0;
    uStackY_1d68 = uStackY_23e8;
    auVar24._16_8_ = local_25c0._0_8_;
    auVar24._0_16_ = auVar3;
    auVar24._24_8_ = local_25c0._8_8_;
    auVar23._8_8_ = uStackY_23f8;
    auVar23._0_8_ = local_2400;
    auVar23._16_8_ = uStackY_23f0;
    auVar23._24_8_ = uStackY_23e8;
    auVar7 = vpmaddwd_avx2(auVar24,auVar23);
    local_1da0 = local_25d0._0_8_;
    uStackY_1d98 = local_25d0._8_8_;
    uStackY_1d90 = local_25e0._0_8_;
    uStackY_1d88 = local_25e0._8_8_;
    local_1dc0 = local_2420;
    uStackY_1db8 = uStackY_2418;
    uStackY_1db0 = uStackY_2410;
    uStackY_1da8 = uStackY_2408;
    auVar22._16_8_ = local_25e0._0_8_;
    auVar22._0_16_ = auVar4;
    auVar22._24_8_ = local_25e0._8_8_;
    auVar21._8_8_ = uStackY_2418;
    auVar21._0_8_ = local_2420;
    auVar21._16_8_ = uStackY_2410;
    auVar21._24_8_ = uStackY_2408;
    auVar8 = vpmaddwd_avx2(auVar22,auVar21);
    local_2780._0_8_ = auVar5._0_8_;
    local_2780._8_8_ = auVar5._8_8_;
    local_2780._16_8_ = auVar5._16_8_;
    local_2780._24_8_ = auVar5._24_8_;
    local_27a0._0_8_ = auVar6._0_8_;
    local_27a0._8_8_ = auVar6._8_8_;
    local_27a0._16_8_ = auVar6._16_8_;
    local_27a0._24_8_ = auVar6._24_8_;
    local_1960 = local_2780._0_8_;
    uStackY_1958 = local_2780._8_8_;
    uStackY_1950 = local_2780._16_8_;
    uStackY_1948 = local_2780._24_8_;
    local_1980 = local_27a0._0_8_;
    uStackY_1978 = local_27a0._8_8_;
    uStackY_1970 = local_27a0._16_8_;
    uStackY_1968 = local_27a0._24_8_;
    local_2680 = vpaddd_avx2(auVar5,auVar6);
    local_27c0._0_8_ = auVar7._0_8_;
    local_27c0._8_8_ = auVar7._8_8_;
    local_27c0._16_8_ = auVar7._16_8_;
    local_27c0._24_8_ = auVar7._24_8_;
    local_27e0._0_8_ = auVar8._0_8_;
    local_27e0._8_8_ = auVar8._8_8_;
    local_27e0._16_8_ = auVar8._16_8_;
    local_27e0._24_8_ = auVar8._24_8_;
    local_19a0 = local_27c0._0_8_;
    uStackY_1998 = local_27c0._8_8_;
    uStackY_1990 = local_27c0._16_8_;
    uStackY_1988 = local_27c0._24_8_;
    local_19c0 = local_27e0._0_8_;
    uStackY_19b8 = local_27e0._8_8_;
    uStackY_19b0 = local_27e0._16_8_;
    uStackY_19a8 = local_27e0._24_8_;
    local_26a0 = vpaddd_avx2(auVar7,auVar8);
    local_1de0 = local_25b0._0_8_;
    uStackY_1dd8 = local_25b0._8_8_;
    uStackY_1dd0 = local_25c0._0_8_;
    uStackY_1dc8 = local_25c0._8_8_;
    local_1e00 = local_2440;
    uStackY_1df8 = uStackY_2438;
    uStackY_1df0 = uStackY_2430;
    uStackY_1de8 = uStackY_2428;
    auVar20._16_8_ = local_25c0._0_8_;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = local_25c0._8_8_;
    auVar19._8_8_ = uStackY_2438;
    auVar19._0_8_ = local_2440;
    auVar19._16_8_ = uStackY_2430;
    auVar19._24_8_ = uStackY_2428;
    local_2780 = vpmaddwd_avx2(auVar20,auVar19);
    local_1e20 = local_25d0._0_8_;
    uStackY_1e18 = local_25d0._8_8_;
    uStackY_1e10 = local_25e0._0_8_;
    uStackY_1e08 = local_25e0._8_8_;
    local_1e40 = local_2460;
    uStackY_1e38 = uStackY_2458;
    uStackY_1e30 = uStackY_2450;
    uStackY_1e28 = uStackY_2448;
    auVar18._16_8_ = local_25e0._0_8_;
    auVar18._0_16_ = auVar4;
    auVar18._24_8_ = local_25e0._8_8_;
    auVar17._8_8_ = uStackY_2458;
    auVar17._0_8_ = local_2460;
    auVar17._16_8_ = uStackY_2450;
    auVar17._24_8_ = uStackY_2448;
    local_27a0 = vpmaddwd_avx2(auVar18,auVar17);
    local_1e60 = local_25b0._0_8_;
    uStackY_1e58 = local_25b0._8_8_;
    uStackY_1e50 = local_25c0._0_8_;
    uStackY_1e48 = local_25c0._8_8_;
    local_1e80 = local_2480;
    uStackY_1e78 = uStackY_2478;
    uStackY_1e70 = uStackY_2470;
    uStackY_1e68 = uStackY_2468;
    auVar16._16_8_ = local_25c0._0_8_;
    auVar16._0_16_ = auVar3;
    auVar16._24_8_ = local_25c0._8_8_;
    auVar15._8_8_ = uStackY_2478;
    auVar15._0_8_ = local_2480;
    auVar15._16_8_ = uStackY_2470;
    auVar15._24_8_ = uStackY_2468;
    local_27c0 = vpmaddwd_avx2(auVar16,auVar15);
    local_1ea0 = local_25d0._0_8_;
    uStackY_1e98 = local_25d0._8_8_;
    uStackY_1e90 = local_25e0._0_8_;
    uStackY_1e88 = local_25e0._8_8_;
    local_1ec0 = local_24a0;
    uStackY_1eb8 = uStackY_2498;
    uStackY_1eb0 = uStackY_2490;
    uStackY_1ea8 = uStackY_2488;
    auVar14._16_8_ = local_25e0._0_8_;
    auVar14._0_16_ = auVar4;
    auVar14._24_8_ = local_25e0._8_8_;
    auVar13._8_8_ = uStackY_2498;
    auVar13._0_8_ = local_24a0;
    auVar13._16_8_ = uStackY_2490;
    auVar13._24_8_ = uStackY_2488;
    local_27e0 = vpmaddwd_avx2(auVar14,auVar13);
    local_19e0 = local_2780._0_8_;
    uStackY_19d8 = local_2780._8_8_;
    uStackY_19d0 = local_2780._16_8_;
    uStackY_19c8 = local_2780._24_8_;
    local_1a00 = local_27a0._0_8_;
    uStackY_19f8 = local_27a0._8_8_;
    uStackY_19f0 = local_27a0._16_8_;
    uStackY_19e8 = local_27a0._24_8_;
    local_26c0 = vpaddd_avx2(local_2780,local_27a0);
    local_1a20 = local_27c0._0_8_;
    uStackY_1a18 = local_27c0._8_8_;
    uStackY_1a10 = local_27c0._16_8_;
    uStackY_1a08 = local_27c0._24_8_;
    local_1a40 = local_27e0._0_8_;
    uStackY_1a38 = local_27e0._8_8_;
    uStackY_1a30 = local_27e0._16_8_;
    uStackY_1a28 = local_27e0._24_8_;
    local_26e0 = vpaddd_avx2(local_27c0,local_27e0);
    local_2328 = (undefined1 (*) [16])(local_2380 + (long)local_2904 * 2);
    local_2530 = *(undefined8 *)*local_2328;
    uStackY_2528 = *(undefined8 *)(*local_2328 + 8);
    local_2330 = (undefined1 (*) [16])(local_2380 + (long)local_2908 * 2 + (long)local_2904 * 2);
    local_2550 = *(undefined8 *)*local_2330;
    uStackY_2548 = *(undefined8 *)(*local_2330 + 8);
    local_2338 = (undefined1 (*) [16])(local_2380 + (long)local_2910 * 2 + (long)local_2904 * 2);
    local_2570 = *(undefined8 *)*local_2338;
    uStackY_2568 = *(undefined8 *)(*local_2338 + 8);
    local_2340 = (undefined1 (*) [16])(local_2380 + (long)local_2918 * 2 + (long)local_2904 * 2);
    local_2590 = *(undefined8 *)*local_2340;
    uStackY_2588 = *(undefined8 *)(*local_2340 + 8);
    local_25b0 = vpunpcklwd_avx(*local_2328,*local_2338);
    local_25c0 = vpunpckhwd_avx(*local_2328,*local_2338);
    local_25d0 = vpunpcklwd_avx(*local_2330,*local_2340);
    local_25e0 = vpunpckhwd_avx(*local_2330,*local_2340);
    local_1ff0 = local_25b0._0_8_;
    uStackY_1fe8 = local_25b0._8_8_;
    local_2000 = local_25d0._0_8_;
    uStackY_1ff8 = local_25d0._8_8_;
    local_1ee0 = local_25b0._0_8_;
    uStackY_1ed8 = local_25b0._8_8_;
    uStackY_1ed0 = local_25c0._0_8_;
    uStackY_1ec8 = local_25c0._8_8_;
    local_1f00 = local_24c0;
    uStackY_1ef8 = uStackY_24b8;
    uStackY_1ef0 = uStackY_24b0;
    uStackY_1ee8 = uStackY_24a8;
    auVar12._16_8_ = local_25c0._0_8_;
    auVar12._0_16_ = local_25b0;
    auVar12._24_8_ = local_25c0._8_8_;
    auVar11._8_8_ = uStackY_24b8;
    auVar11._0_8_ = local_24c0;
    auVar11._16_8_ = uStackY_24b0;
    auVar11._24_8_ = uStackY_24a8;
    local_2700 = vpmaddwd_avx2(auVar12,auVar11);
    local_1f20 = local_25b0._0_8_;
    uStackY_1f18 = local_25b0._8_8_;
    uStackY_1f10 = local_25c0._0_8_;
    uStackY_1f08 = local_25c0._8_8_;
    local_1f40 = local_24e0;
    uStackY_1f38 = uStackY_24d8;
    uStackY_1f30 = uStackY_24d0;
    uStackY_1f28 = uStackY_24c8;
    auVar10._16_8_ = local_25c0._0_8_;
    auVar10._0_16_ = local_25b0;
    auVar10._24_8_ = local_25c0._8_8_;
    auVar9._8_8_ = uStackY_24d8;
    auVar9._0_8_ = local_24e0;
    auVar9._16_8_ = uStackY_24d0;
    auVar9._24_8_ = uStackY_24c8;
    local_2720 = vpmaddwd_avx2(auVar10,auVar9);
    local_1f60 = local_25d0._0_8_;
    uStackY_1f58 = local_25d0._8_8_;
    uStackY_1f50 = local_25e0._0_8_;
    uStackY_1f48 = local_25e0._8_8_;
    local_1f80 = local_2500;
    uStackY_1f78 = uStackY_24f8;
    uStackY_1f70 = uStackY_24f0;
    uStackY_1f68 = uStackY_24e8;
    auVar8._16_8_ = local_25e0._0_8_;
    auVar8._0_16_ = local_25d0;
    auVar8._24_8_ = local_25e0._8_8_;
    auVar7._8_8_ = uStackY_24f8;
    auVar7._0_8_ = local_2500;
    auVar7._16_8_ = uStackY_24f0;
    auVar7._24_8_ = uStackY_24e8;
    local_2740 = vpmaddwd_avx2(auVar8,auVar7);
    local_1fa0 = local_25d0._0_8_;
    uStackY_1f98 = local_25d0._8_8_;
    uStackY_1f90 = local_25e0._0_8_;
    uStackY_1f88 = local_25e0._8_8_;
    local_1fc0 = local_2520;
    uStackY_1fb8 = uStackY_2518;
    uStackY_1fb0 = uStackY_2510;
    uStackY_1fa8 = uStackY_2508;
    auVar6._16_8_ = local_25e0._0_8_;
    auVar6._0_16_ = local_25d0;
    auVar6._24_8_ = local_25e0._8_8_;
    auVar5._8_8_ = uStackY_2518;
    auVar5._0_8_ = local_2520;
    auVar5._16_8_ = uStackY_2510;
    auVar5._24_8_ = uStackY_2508;
    local_2760 = vpmaddwd_avx2(auVar6,auVar5);
    local_1a60 = local_2700._0_8_;
    uStackY_1a58 = local_2700._8_8_;
    uStackY_1a50 = local_2700._16_8_;
    uStackY_1a48 = local_2700._24_8_;
    local_1a80 = local_2740._0_8_;
    uStackY_1a78 = local_2740._8_8_;
    uStackY_1a70 = local_2740._16_8_;
    uStackY_1a68 = local_2740._24_8_;
    auVar5 = vpaddd_avx2(local_2700,local_2740);
    local_17e0 = local_2700._0_8_;
    uStackY_17d8 = local_2700._8_8_;
    uStackY_17d0 = local_2700._16_8_;
    uStackY_17c8 = local_2700._24_8_;
    local_1800 = local_2740._0_8_;
    uStackY_17f8 = local_2740._8_8_;
    uStackY_17f0 = local_2740._16_8_;
    uStackY_17e8 = local_2740._24_8_;
    auVar7 = vpsubd_avx2(local_2700,local_2740);
    local_1aa0 = local_2720._0_8_;
    uStackY_1a98 = local_2720._8_8_;
    uStackY_1a90 = local_2720._16_8_;
    uStackY_1a88 = local_2720._24_8_;
    local_1ac0 = local_2760._0_8_;
    uStackY_1ab8 = local_2760._8_8_;
    uStackY_1ab0 = local_2760._16_8_;
    uStackY_1aa8 = local_2760._24_8_;
    auVar6 = vpaddd_avx2(local_2720,local_2760);
    local_1820 = local_2720._0_8_;
    uStackY_1818 = local_2720._8_8_;
    uStackY_1810 = local_2720._16_8_;
    uStackY_1808 = local_2720._24_8_;
    local_1840 = local_2760._0_8_;
    uStackY_1838 = local_2760._8_8_;
    uStackY_1830 = local_2760._16_8_;
    uStackY_1828 = local_2760._24_8_;
    auVar8 = vpsubd_avx2(local_2720,local_2760);
    local_2600._0_8_ = auVar5._0_8_;
    local_2600._8_8_ = auVar5._8_8_;
    local_2600._16_8_ = auVar5._16_8_;
    local_2600._24_8_ = auVar5._24_8_;
    local_1ae0 = local_2600._0_8_;
    uStackY_1ad8 = local_2600._8_8_;
    uStackY_1ad0 = local_2600._16_8_;
    uStackY_1ac8 = local_2600._24_8_;
    auVar32._16_8_ = auStackY_28f0._0_8_;
    auVar32._0_16_ = auVar41;
    auVar32._24_8_ = auStackY_28f0._8_8_;
    local_2600 = vpaddd_avx2(auVar5,auVar32);
    local_2660._0_8_ = auVar7._0_8_;
    local_2660._8_8_ = auVar7._8_8_;
    local_2660._16_8_ = auVar7._16_8_;
    local_2660._24_8_ = auVar7._24_8_;
    local_1b20 = local_2660._0_8_;
    uStackY_1b18 = local_2660._8_8_;
    uStackY_1b10 = local_2660._16_8_;
    uStackY_1b08 = local_2660._24_8_;
    auVar31._16_8_ = auStackY_28f0._0_8_;
    auVar31._0_16_ = auVar41;
    auVar31._24_8_ = auStackY_28f0._8_8_;
    local_2660 = vpaddd_avx2(auVar7,auVar31);
    local_2620._0_8_ = auVar6._0_8_;
    local_2620._8_8_ = auVar6._8_8_;
    local_2620._16_8_ = auVar6._16_8_;
    local_2620._24_8_ = auVar6._24_8_;
    local_1b60 = local_2620._0_8_;
    uStackY_1b58 = local_2620._8_8_;
    uStackY_1b50 = local_2620._16_8_;
    uStackY_1b48 = local_2620._24_8_;
    auVar30._16_8_ = auStackY_28f0._0_8_;
    auVar30._0_16_ = auVar41;
    auVar30._24_8_ = auStackY_28f0._8_8_;
    local_2620 = vpaddd_avx2(auVar6,auVar30);
    local_2640._0_8_ = auVar8._0_8_;
    local_2640._8_8_ = auVar8._8_8_;
    local_2640._16_8_ = auVar8._16_8_;
    local_2640._24_8_ = auVar8._24_8_;
    local_1ba0 = local_2640._0_8_;
    uStackY_1b98 = local_2640._8_8_;
    uStackY_1b90 = local_2640._16_8_;
    uStackY_1b88 = local_2640._24_8_;
    auVar29._16_8_ = auStackY_28f0._0_8_;
    auVar29._0_16_ = auVar41;
    auVar29._24_8_ = auStackY_28f0._8_8_;
    local_2640 = vpaddd_avx2(auVar8,auVar29);
    local_1be0 = local_2600._0_8_;
    uStackY_1bd8 = local_2600._8_8_;
    uStackY_1bd0 = local_2600._16_8_;
    uStackY_1bc8 = local_2600._24_8_;
    local_1c00 = local_2680._0_8_;
    uStackY_1bf8 = local_2680._8_8_;
    uStackY_1bf0 = local_2680._16_8_;
    uStackY_1be8 = local_2680._24_8_;
    auVar5 = vpaddd_avx2(local_2600,local_2680);
    local_1860 = local_2600._0_8_;
    uStackY_1858 = local_2600._8_8_;
    uStackY_1850 = local_2600._16_8_;
    uStackY_1848 = local_2600._24_8_;
    local_1880 = local_2680._0_8_;
    uStackY_1878 = local_2680._8_8_;
    uStackY_1870 = local_2680._16_8_;
    uStackY_1868 = local_2680._24_8_;
    auVar9 = vpsubd_avx2(local_2600,local_2680);
    local_1c20 = local_2620._0_8_;
    uStackY_1c18 = local_2620._8_8_;
    uStackY_1c10 = local_2620._16_8_;
    uStackY_1c08 = local_2620._24_8_;
    local_1c40 = local_26a0._0_8_;
    uStackY_1c38 = local_26a0._8_8_;
    uStackY_1c30 = local_26a0._16_8_;
    uStackY_1c28 = local_26a0._24_8_;
    auVar6 = vpaddd_avx2(local_2620,local_26a0);
    local_18a0 = local_2620._0_8_;
    uStackY_1898 = local_2620._8_8_;
    uStackY_1890 = local_2620._16_8_;
    uStackY_1888 = local_2620._24_8_;
    local_18c0 = local_26a0._0_8_;
    uStackY_18b8 = local_26a0._8_8_;
    uStackY_18b0 = local_26a0._16_8_;
    uStackY_18a8 = local_26a0._24_8_;
    auVar10 = vpsubd_avx2(local_2620,local_26a0);
    local_1c60 = local_2640._0_8_;
    uStackY_1c58 = local_2640._8_8_;
    uStackY_1c50 = local_2640._16_8_;
    uStackY_1c48 = local_2640._24_8_;
    local_1c80 = local_26c0._0_8_;
    uStackY_1c78 = local_26c0._8_8_;
    uStackY_1c70 = local_26c0._16_8_;
    uStackY_1c68 = local_26c0._24_8_;
    auVar7 = vpaddd_avx2(local_2640,local_26c0);
    local_18e0 = local_2640._0_8_;
    uStackY_18d8 = local_2640._8_8_;
    uStackY_18d0 = local_2640._16_8_;
    uStackY_18c8 = local_2640._24_8_;
    local_1900 = local_26c0._0_8_;
    uStackY_18f8 = local_26c0._8_8_;
    uStackY_18f0 = local_26c0._16_8_;
    uStackY_18e8 = local_26c0._24_8_;
    auVar11 = vpsubd_avx2(local_2640,local_26c0);
    local_1ca0 = local_2660._0_8_;
    uStackY_1c98 = local_2660._8_8_;
    uStackY_1c90 = local_2660._16_8_;
    uStackY_1c88 = local_2660._24_8_;
    local_1cc0 = local_26e0._0_8_;
    uStackY_1cb8 = local_26e0._8_8_;
    uStackY_1cb0 = local_26e0._16_8_;
    uStackY_1ca8 = local_26e0._24_8_;
    auVar8 = vpaddd_avx2(local_2660,local_26e0);
    local_1920 = local_2660._0_8_;
    uStackY_1918 = local_2660._8_8_;
    uStackY_1910 = local_2660._16_8_;
    uStackY_1908 = local_2660._24_8_;
    local_1940 = local_26e0._0_8_;
    uStackY_1938 = local_26e0._8_8_;
    uStackY_1930 = local_26e0._16_8_;
    uStackY_1928 = local_26e0._24_8_;
    auVar12 = vpsubd_avx2(local_2660,local_26e0);
    local_2800._0_8_ = auVar5._0_8_;
    local_2800._8_8_ = auVar5._8_8_;
    local_2800._16_8_ = auVar5._16_8_;
    local_2800._24_8_ = auVar5._24_8_;
    local_15e0 = local_2800._0_8_;
    uStackY_15d8 = local_2800._8_8_;
    uStackY_15d0 = local_2800._16_8_;
    uStackY_15c8 = local_2800._24_8_;
    local_15e4 = local_2398;
    auVar5 = vpsrad_avx2(auVar5,ZEXT416(local_2398));
    local_28e0._0_8_ = auVar9._0_8_;
    local_28e0._8_8_ = auVar9._8_8_;
    local_28e0._16_8_ = auVar9._16_8_;
    local_28e0._24_8_ = auVar9._24_8_;
    local_1620 = local_28e0._0_8_;
    uStackY_1618 = local_28e0._8_8_;
    uStackY_1610 = local_28e0._16_8_;
    uStackY_1608 = local_28e0._24_8_;
    local_1624 = local_2398;
    auVar9 = vpsrad_avx2(auVar9,ZEXT416(local_2398));
    local_2820._0_8_ = auVar6._0_8_;
    local_2820._8_8_ = auVar6._8_8_;
    local_2820._16_8_ = auVar6._16_8_;
    local_2820._24_8_ = auVar6._24_8_;
    local_1660 = local_2820._0_8_;
    uStackY_1658 = local_2820._8_8_;
    uStackY_1650 = local_2820._16_8_;
    uStackY_1648 = local_2820._24_8_;
    local_1664 = local_2398;
    auVar6 = vpsrad_avx2(auVar6,ZEXT416(local_2398));
    local_28c0._0_8_ = auVar10._0_8_;
    local_28c0._8_8_ = auVar10._8_8_;
    local_28c0._16_8_ = auVar10._16_8_;
    local_28c0._24_8_ = auVar10._24_8_;
    local_16a0 = local_28c0._0_8_;
    uStackY_1698 = local_28c0._8_8_;
    uStackY_1690 = local_28c0._16_8_;
    uStackY_1688 = local_28c0._24_8_;
    local_16a4 = local_2398;
    auVar10 = vpsrad_avx2(auVar10,ZEXT416(local_2398));
    local_2840._0_8_ = auVar7._0_8_;
    local_2840._8_8_ = auVar7._8_8_;
    local_2840._16_8_ = auVar7._16_8_;
    local_2840._24_8_ = auVar7._24_8_;
    local_16e0 = local_2840._0_8_;
    uStackY_16d8 = local_2840._8_8_;
    uStackY_16d0 = local_2840._16_8_;
    uStackY_16c8 = local_2840._24_8_;
    local_16e4 = local_2398;
    auVar7 = vpsrad_avx2(auVar7,ZEXT416(local_2398));
    local_28a0._0_8_ = auVar11._0_8_;
    local_28a0._8_8_ = auVar11._8_8_;
    local_28a0._16_8_ = auVar11._16_8_;
    local_28a0._24_8_ = auVar11._24_8_;
    local_1720 = local_28a0._0_8_;
    uStackY_1718 = local_28a0._8_8_;
    uStackY_1710 = local_28a0._16_8_;
    uStackY_1708 = local_28a0._24_8_;
    local_1724 = local_2398;
    auVar11 = vpsrad_avx2(auVar11,ZEXT416(local_2398));
    local_2860._0_8_ = auVar8._0_8_;
    local_2860._8_8_ = auVar8._8_8_;
    local_2860._16_8_ = auVar8._16_8_;
    local_2860._24_8_ = auVar8._24_8_;
    local_1760 = local_2860._0_8_;
    uStackY_1758 = local_2860._8_8_;
    uStackY_1750 = local_2860._16_8_;
    uStackY_1748 = local_2860._24_8_;
    local_1764 = local_2398;
    auVar8 = vpsrad_avx2(auVar8,ZEXT416(local_2398));
    local_2880._0_8_ = auVar12._0_8_;
    local_2880._8_8_ = auVar12._8_8_;
    local_2880._16_8_ = auVar12._16_8_;
    local_2880._24_8_ = auVar12._24_8_;
    local_17a0 = local_2880._0_8_;
    uStackY_1798 = local_2880._8_8_;
    uStackY_1790 = local_2880._16_8_;
    uStackY_1788 = local_2880._24_8_;
    local_17a4 = local_2398;
    auVar12 = vpsrad_avx2(auVar12,ZEXT416(local_2398));
    local_2800._0_8_ = auVar5._0_8_;
    local_2800._8_8_ = auVar5._8_8_;
    local_2800._16_8_ = auVar5._16_8_;
    local_2800._24_8_ = auVar5._24_8_;
    local_2880._0_8_ = auVar12._0_8_;
    local_2880._8_8_ = auVar12._8_8_;
    local_2880._16_8_ = auVar12._16_8_;
    local_2880._24_8_ = auVar12._24_8_;
    local_14e0 = local_2800._0_8_;
    uStackY_14d8 = local_2800._8_8_;
    uStackY_14d0 = local_2800._16_8_;
    uStackY_14c8 = local_2800._24_8_;
    local_1500 = local_2880._0_8_;
    uStackY_14f8 = local_2880._8_8_;
    uStackY_14f0 = local_2880._16_8_;
    uStackY_14e8 = local_2880._24_8_;
    auVar5 = vpackssdw_avx2(auVar5,auVar12);
    local_2820._0_8_ = auVar6._0_8_;
    local_2820._8_8_ = auVar6._8_8_;
    local_2820._16_8_ = auVar6._16_8_;
    local_2820._24_8_ = auVar6._24_8_;
    local_28a0._0_8_ = auVar11._0_8_;
    local_28a0._8_8_ = auVar11._8_8_;
    local_28a0._16_8_ = auVar11._16_8_;
    local_28a0._24_8_ = auVar11._24_8_;
    local_1520 = local_2820._0_8_;
    uStackY_1518 = local_2820._8_8_;
    uStackY_1510 = local_2820._16_8_;
    uStackY_1508 = local_2820._24_8_;
    local_1540 = local_28a0._0_8_;
    uStackY_1538 = local_28a0._8_8_;
    uStackY_1530 = local_28a0._16_8_;
    uStackY_1528 = local_28a0._24_8_;
    auVar6 = vpackssdw_avx2(auVar6,auVar11);
    local_2840._0_8_ = auVar7._0_8_;
    local_2840._8_8_ = auVar7._8_8_;
    local_2840._16_8_ = auVar7._16_8_;
    local_2840._24_8_ = auVar7._24_8_;
    local_28c0._0_8_ = auVar10._0_8_;
    local_28c0._8_8_ = auVar10._8_8_;
    local_28c0._16_8_ = auVar10._16_8_;
    local_28c0._24_8_ = auVar10._24_8_;
    local_1560 = local_2840._0_8_;
    uStackY_1558 = local_2840._8_8_;
    uStackY_1550 = local_2840._16_8_;
    uStackY_1548 = local_2840._24_8_;
    local_1580 = local_28c0._0_8_;
    uStackY_1578 = local_28c0._8_8_;
    uStackY_1570 = local_28c0._16_8_;
    uStackY_1568 = local_28c0._24_8_;
    auVar7 = vpackssdw_avx2(auVar7,auVar10);
    local_2860._0_8_ = auVar8._0_8_;
    local_2860._8_8_ = auVar8._8_8_;
    local_2860._16_8_ = auVar8._16_8_;
    local_2860._24_8_ = auVar8._24_8_;
    local_28e0._0_8_ = auVar9._0_8_;
    local_28e0._8_8_ = auVar9._8_8_;
    local_28e0._16_8_ = auVar9._16_8_;
    local_28e0._24_8_ = auVar9._24_8_;
    local_15a0 = local_2860._0_8_;
    uStackY_1598 = local_2860._8_8_;
    uStackY_1590 = local_2860._16_8_;
    uStackY_1588 = local_2860._24_8_;
    local_15c0 = local_28e0._0_8_;
    uStackY_15b8 = local_28e0._8_8_;
    uStackY_15b0 = local_28e0._16_8_;
    uStackY_15a8 = local_28e0._24_8_;
    auVar8 = vpackssdw_avx2(auVar8,auVar9);
    local_2800._0_8_ = auVar5._0_8_;
    local_2800._8_8_ = auVar5._8_8_;
    local_2800._16_8_ = auVar5._16_8_;
    local_2800._24_8_ = auVar5._24_8_;
    local_2840._0_8_ = auVar7._0_8_;
    local_2840._8_8_ = auVar7._8_8_;
    local_2840._16_8_ = auVar7._16_8_;
    local_2840._24_8_ = auVar7._24_8_;
    local_13e0 = local_2800._0_8_;
    uStackY_13d8 = local_2800._8_8_;
    uStackY_13d0 = local_2800._16_8_;
    uStackY_13c8 = local_2800._24_8_;
    local_1400 = local_2840._0_8_;
    uStackY_13f8 = local_2840._8_8_;
    uStackY_13f0 = local_2840._16_8_;
    uStackY_13e8 = local_2840._24_8_;
    auVar9 = vpunpcklwd_avx2(auVar5,auVar7);
    local_12e0 = local_2800._0_8_;
    uStackY_12d8 = local_2800._8_8_;
    uStackY_12d0 = local_2800._16_8_;
    uStackY_12c8 = local_2800._24_8_;
    local_1300 = local_2840._0_8_;
    uStackY_12f8 = local_2840._8_8_;
    uStackY_12f0 = local_2840._16_8_;
    uStackY_12e8 = local_2840._24_8_;
    auVar5 = vpunpckhwd_avx2(auVar5,auVar7);
    local_2820._0_8_ = auVar6._0_8_;
    local_2820._8_8_ = auVar6._8_8_;
    local_2820._16_8_ = auVar6._16_8_;
    local_2820._24_8_ = auVar6._24_8_;
    local_2860._0_8_ = auVar8._0_8_;
    local_2860._8_8_ = auVar8._8_8_;
    local_2860._16_8_ = auVar8._16_8_;
    local_2860._24_8_ = auVar8._24_8_;
    local_1420 = local_2820._0_8_;
    uStackY_1418 = local_2820._8_8_;
    uStackY_1410 = local_2820._16_8_;
    uStackY_1408 = local_2820._24_8_;
    local_1440 = local_2860._0_8_;
    uStackY_1438 = local_2860._8_8_;
    uStackY_1430 = local_2860._16_8_;
    uStackY_1428 = local_2860._24_8_;
    auVar7 = vpunpcklwd_avx2(auVar6,auVar8);
    local_1320 = local_2820._0_8_;
    uStackY_1318 = local_2820._8_8_;
    uStackY_1310 = local_2820._16_8_;
    uStackY_1308 = local_2820._24_8_;
    local_1340 = local_2860._0_8_;
    uStackY_1338 = local_2860._8_8_;
    uStackY_1330 = local_2860._16_8_;
    uStackY_1328 = local_2860._24_8_;
    auVar6 = vpunpckhwd_avx2(auVar6,auVar8);
    local_2880._0_8_ = auVar9._0_8_;
    local_2880._8_8_ = auVar9._8_8_;
    local_2880._16_8_ = auVar9._16_8_;
    local_2880._24_8_ = auVar9._24_8_;
    local_28c0._0_8_ = auVar7._0_8_;
    local_28c0._8_8_ = auVar7._8_8_;
    local_28c0._16_8_ = auVar7._16_8_;
    local_28c0._24_8_ = auVar7._24_8_;
    local_1460 = local_2880._0_8_;
    uStackY_1458 = local_2880._8_8_;
    uStackY_1450 = local_2880._16_8_;
    uStackY_1448 = local_2880._24_8_;
    local_1480 = local_28c0._0_8_;
    uStackY_1478 = local_28c0._8_8_;
    uStackY_1470 = local_28c0._16_8_;
    uStackY_1468 = local_28c0._24_8_;
    auVar8 = vpunpcklwd_avx2(auVar9,auVar7);
    local_1360 = local_2880._0_8_;
    uStackY_1358 = local_2880._8_8_;
    uStackY_1350 = local_2880._16_8_;
    uStackY_1348 = local_2880._24_8_;
    local_1380 = local_28c0._0_8_;
    uStackY_1378 = local_28c0._8_8_;
    uStackY_1370 = local_28c0._16_8_;
    uStackY_1368 = local_28c0._24_8_;
    auVar7 = vpunpckhwd_avx2(auVar9,auVar7);
    local_28a0._0_8_ = auVar5._0_8_;
    local_28a0._8_8_ = auVar5._8_8_;
    local_28a0._16_8_ = auVar5._16_8_;
    local_28a0._24_8_ = auVar5._24_8_;
    local_28e0._0_8_ = auVar6._0_8_;
    local_28e0._8_8_ = auVar6._8_8_;
    local_28e0._16_8_ = auVar6._16_8_;
    local_28e0._24_8_ = auVar6._24_8_;
    local_14a0 = local_28a0._0_8_;
    uStackY_1498 = local_28a0._8_8_;
    uStackY_1490 = local_28a0._16_8_;
    uStackY_1488 = local_28a0._24_8_;
    local_14c0 = local_28e0._0_8_;
    uStackY_14b8 = local_28e0._8_8_;
    uStackY_14b0 = local_28e0._16_8_;
    uStackY_14a8 = local_28e0._24_8_;
    auVar9 = vpunpcklwd_avx2(auVar5,auVar6);
    local_13a0 = local_28a0._0_8_;
    uStackY_1398 = local_28a0._8_8_;
    uStackY_1390 = local_28a0._16_8_;
    uStackY_1388 = local_28a0._24_8_;
    local_13c0 = local_28e0._0_8_;
    uStackY_13b8 = local_28e0._8_8_;
    uStackY_13b0 = local_28e0._16_8_;
    uStackY_13a8 = local_28e0._24_8_;
    auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
    local_2800._0_8_ = auVar8._0_8_;
    local_2800._8_8_ = auVar8._8_8_;
    local_2800._16_8_ = auVar8._16_8_;
    local_2800._24_8_ = auVar8._24_8_;
    local_2840._0_8_ = auVar9._0_8_;
    local_2840._8_8_ = auVar9._8_8_;
    local_2840._16_8_ = auVar9._16_8_;
    local_2840._24_8_ = auVar9._24_8_;
    local_1260 = local_2800._0_8_;
    uStackY_1258 = local_2800._8_8_;
    uStackY_1250 = local_2800._16_8_;
    uStackY_1248 = local_2800._24_8_;
    local_1280 = local_2840._0_8_;
    uStackY_1278 = local_2840._8_8_;
    uStackY_1270 = local_2840._16_8_;
    uStackY_1268 = local_2840._24_8_;
    local_2880 = vpunpcklqdq_avx2(auVar8,auVar9);
    local_11e0 = local_2800._0_8_;
    uStackY_11d8 = local_2800._8_8_;
    uStackY_11d0 = local_2800._16_8_;
    uStackY_11c8 = local_2800._24_8_;
    local_1200 = local_2840._0_8_;
    uStackY_11f8 = local_2840._8_8_;
    uStackY_11f0 = local_2840._16_8_;
    uStackY_11e8 = local_2840._24_8_;
    local_28a0 = vpunpckhqdq_avx2(auVar8,auVar9);
    local_2820._0_8_ = auVar7._0_8_;
    local_2820._8_8_ = auVar7._8_8_;
    local_2820._16_8_ = auVar7._16_8_;
    local_2820._24_8_ = auVar7._24_8_;
    local_2860._0_8_ = auVar5._0_8_;
    local_2860._8_8_ = auVar5._8_8_;
    local_2860._16_8_ = auVar5._16_8_;
    local_2860._24_8_ = auVar5._24_8_;
    local_12a0 = local_2820._0_8_;
    uStackY_1298 = local_2820._8_8_;
    uStackY_1290 = local_2820._16_8_;
    uStackY_1288 = local_2820._24_8_;
    local_12c0 = local_2860._0_8_;
    uStackY_12b8 = local_2860._8_8_;
    uStackY_12b0 = local_2860._16_8_;
    uStackY_12a8 = local_2860._24_8_;
    local_28c0 = vpunpcklqdq_avx2(auVar7,auVar5);
    local_1220 = local_2820._0_8_;
    uStackY_1218 = local_2820._8_8_;
    uStackY_1210 = local_2820._16_8_;
    uStackY_1208 = local_2820._24_8_;
    local_1240 = local_2860._0_8_;
    uStackY_1238 = local_2860._8_8_;
    uStackY_1230 = local_2860._16_8_;
    uStackY_1228 = local_2860._24_8_;
    local_28e0 = vpunpckhqdq_avx2(auVar7,auVar5);
    local_2800 = vperm2i128_avx2(local_2880,local_28a0,0x20);
    local_2840 = vperm2i128_avx2(local_2880,local_28a0,0x31);
    local_2820 = vperm2i128_avx2(local_28c0,local_28e0,0x20);
    local_2860 = vperm2i128_avx2(local_28c0,local_28e0,0x31);
    if (local_239c != 0xf) {
      local_11a2 = (short)(1 << ((byte)local_239c & 0x1f)) - 1;
      auVar1 = vpinsrw_avx(ZEXT216(local_11a2),(uint)local_11a2,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,6);
      local_b20 = vpinsrw_avx(auVar1,(uint)local_11a2,7);
      auVar1 = vpinsrw_avx(ZEXT216(local_11a2),(uint)local_11a2,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a2,6);
      auStackY_b10 = vpinsrw_avx(auVar1,(uint)local_11a2,7);
      local_2940 = local_b20._0_8_;
      uStackY_2938 = local_b20._8_8_;
      uStackY_2930 = auStackY_b10._0_8_;
      uStackY_2928 = auStackY_b10._8_8_;
      local_11a4 = -(short)(1 << ((byte)local_239c & 0x1f));
      auVar1 = vpinsrw_avx(ZEXT216(local_11a4),(uint)local_11a4,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a4,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a4,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a4,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a4,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a4,6);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_11a4,7);
      auVar2 = vpinsrw_avx(ZEXT216(local_11a4),(uint)local_11a4,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_11a4,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_11a4,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_11a4,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_11a4,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_11a4,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_11a4,7);
      auVar47._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar47._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      local_b60._16_8_ = auVar47._16_8_;
      local_b60._24_8_ = auVar47._24_8_;
      local_10c0 = local_2880._0_8_;
      uStackY_10b8 = local_2880._8_8_;
      uStackY_10b0 = local_2880._16_8_;
      uStackY_10a8 = local_2880._24_8_;
      local_10e0 = local_b20._0_8_;
      uStackY_10d8 = local_b20._8_8_;
      uStackY_10d0 = auStackY_b10._0_8_;
      uStackY_10c8 = auStackY_b10._8_8_;
      auVar36._16_8_ = auStackY_b10._0_8_;
      auVar36._0_16_ = local_b20;
      auVar36._24_8_ = auStackY_b10._8_8_;
      auVar5 = vpminsw_avx2(local_2880,auVar36);
      local_1100 = local_28a0._0_8_;
      uStackY_10f8 = local_28a0._8_8_;
      uStackY_10f0 = local_28a0._16_8_;
      uStackY_10e8 = local_28a0._24_8_;
      local_1120 = local_b20._0_8_;
      uStackY_1118 = local_b20._8_8_;
      uStackY_1110 = auStackY_b10._0_8_;
      uStackY_1108 = auStackY_b10._8_8_;
      auVar35._16_8_ = auStackY_b10._0_8_;
      auVar35._0_16_ = local_b20;
      auVar35._24_8_ = auStackY_b10._8_8_;
      auVar6 = vpminsw_avx2(local_28a0,auVar35);
      local_1140 = local_28c0._0_8_;
      uStackY_1138 = local_28c0._8_8_;
      uStackY_1130 = local_28c0._16_8_;
      uStackY_1128 = local_28c0._24_8_;
      local_1160 = local_b20._0_8_;
      uStackY_1158 = local_b20._8_8_;
      uStackY_1150 = auStackY_b10._0_8_;
      uStackY_1148 = auStackY_b10._8_8_;
      auVar34._16_8_ = auStackY_b10._0_8_;
      auVar34._0_16_ = local_b20;
      auVar34._24_8_ = auStackY_b10._8_8_;
      auVar7 = vpminsw_avx2(local_28c0,auVar34);
      local_1180 = local_28e0._0_8_;
      uStackY_1178 = local_28e0._8_8_;
      uStackY_1170 = local_28e0._16_8_;
      uStackY_1168 = local_28e0._24_8_;
      local_11a0 = local_b20._0_8_;
      uStackY_1198 = local_b20._8_8_;
      uStackY_1190 = auStackY_b10._0_8_;
      uStackY_1188 = auStackY_b10._8_8_;
      auVar33._16_8_ = auStackY_b10._0_8_;
      auVar33._0_16_ = local_b20;
      auVar33._24_8_ = auStackY_b10._8_8_;
      auVar8 = vpminsw_avx2(local_28e0,auVar33);
      local_2880._0_8_ = auVar5._0_8_;
      local_2880._8_8_ = auVar5._8_8_;
      local_2880._16_8_ = auVar5._16_8_;
      local_2880._24_8_ = auVar5._24_8_;
      local_fc0 = local_2880._0_8_;
      uStackY_fb8 = local_2880._8_8_;
      uStackY_fb0 = local_2880._16_8_;
      uStackY_fa8 = local_2880._24_8_;
      auVar40._16_8_ = local_b60._16_8_;
      auVar40._0_16_ = auVar47._0_16_;
      auVar40._24_8_ = local_b60._24_8_;
      local_2880 = vpmaxsw_avx2(auVar5,auVar40);
      local_28a0._0_8_ = auVar6._0_8_;
      local_28a0._8_8_ = auVar6._8_8_;
      local_28a0._16_8_ = auVar6._16_8_;
      local_28a0._24_8_ = auVar6._24_8_;
      local_1000 = local_28a0._0_8_;
      uStackY_ff8 = local_28a0._8_8_;
      uStackY_ff0 = local_28a0._16_8_;
      uStackY_fe8 = local_28a0._24_8_;
      auVar39._16_8_ = local_b60._16_8_;
      auVar39._0_16_ = auVar47._0_16_;
      auVar39._24_8_ = local_b60._24_8_;
      local_28a0 = vpmaxsw_avx2(auVar6,auVar39);
      local_28c0._0_8_ = auVar7._0_8_;
      local_28c0._8_8_ = auVar7._8_8_;
      local_28c0._16_8_ = auVar7._16_8_;
      local_28c0._24_8_ = auVar7._24_8_;
      local_1040 = local_28c0._0_8_;
      uStackY_1038 = local_28c0._8_8_;
      uStackY_1030 = local_28c0._16_8_;
      uStackY_1028 = local_28c0._24_8_;
      auVar38._16_8_ = local_b60._16_8_;
      auVar38._0_16_ = auVar47._0_16_;
      auVar38._24_8_ = local_b60._24_8_;
      local_28c0 = vpmaxsw_avx2(auVar7,auVar38);
      local_28e0._0_8_ = auVar8._0_8_;
      local_28e0._8_8_ = auVar8._8_8_;
      local_28e0._16_8_ = auVar8._16_8_;
      local_28e0._24_8_ = auVar8._24_8_;
      local_1080 = local_28e0._0_8_;
      uStackY_1078 = local_28e0._8_8_;
      uStackY_1070 = local_28e0._16_8_;
      uStackY_1068 = local_28e0._24_8_;
      auVar37._16_8_ = local_b60._16_8_;
      auVar37._0_16_ = auVar47._0_16_;
      auVar37._24_8_ = local_b60._24_8_;
      local_28e0 = vpmaxsw_avx2(auVar8,auVar37);
      local_b60 = auVar47;
      local_b40 = local_11a4;
      local_b3e = local_11a4;
      local_b3c = local_11a4;
      local_b3a = local_11a4;
      local_b38 = local_11a4;
      local_b36 = local_11a4;
      local_b34 = local_11a4;
      local_b32 = local_11a4;
      local_b30 = local_11a4;
      local_b2e = local_11a4;
      local_b2c = local_11a4;
      local_b2a = local_11a4;
      local_b28 = local_11a4;
      local_b26 = local_11a4;
      local_b24 = local_11a4;
      local_b22 = local_11a4;
      local_b00 = local_11a2;
      local_afe = local_11a2;
      local_afc = local_11a2;
      local_afa = local_11a2;
      local_af8 = local_11a2;
      local_af6 = local_11a2;
      local_af4 = local_11a2;
      local_af2 = local_11a2;
      local_af0 = local_11a2;
      local_aee = local_11a2;
      local_aec = local_11a2;
      local_aea = local_11a2;
      local_ae8 = local_11a2;
      local_ae6 = local_11a2;
      local_ae4 = local_11a2;
      local_ae2 = local_11a2;
      local_fe0 = auVar47._0_16_;
      auStackY_fd0 = auVar47._16_16_;
      local_1020 = auVar47._0_16_;
      auStackY_1010 = auVar47._16_16_;
      local_1060 = auVar47._0_16_;
      auStackY_1050 = auVar47._16_16_;
      local_10a0 = auVar47._0_16_;
      auStackY_1090 = auVar47._16_16_;
    }
    uVar43 = local_2800._8_8_;
    uVar44 = local_2800._16_8_;
    uVar45 = local_2800._24_8_;
    local_ea8 = local_2390;
    local_ee0 = local_2800._0_8_;
    uStackY_ed8 = local_2800._8_8_;
    uStackY_ed0 = local_2800._16_8_;
    uStackY_ec8 = local_2800._24_8_;
    local_2180 = local_2590;
    uStackY_2178 = uStackY_2588;
    local_2170 = local_2550;
    uStackY_2168 = uStackY_2548;
    local_2160 = local_2570;
    uStackY_2158 = uStackY_2568;
    local_2150 = local_2530;
    uStackY_2148 = uStackY_2528;
    local_2140 = local_25a0;
    uStackY_2138 = uStackY_2598;
    local_2130 = local_2580;
    uStackY_2128 = uStackY_2578;
    local_2120 = local_2560;
    uStackY_2118 = uStackY_2558;
    local_2110 = local_2540;
    uStackY_2108 = uStackY_2538;
    local_2080 = local_2590;
    uStackY_2078 = uStackY_2588;
    local_2070 = local_2550;
    uStackY_2068 = uStackY_2548;
    local_2060 = local_2570;
    uStackY_2058 = uStackY_2568;
    local_2050 = local_2530;
    uStackY_2048 = uStackY_2528;
    local_2040 = local_25a0;
    uStackY_2038 = uStackY_2598;
    local_2030 = local_2580;
    uStackY_2028 = uStackY_2578;
    local_2020 = local_2560;
    uStackY_2018 = uStackY_2558;
    local_2010 = local_2540;
    uStackY_2008 = uStackY_2538;
    local_2960 = auVar47._0_16_;
    auStackY_2950 = auVar47._16_16_;
    *local_2390 = local_2800._0_8_;
    puVar46[1] = uVar43;
    puVar46[2] = uVar44;
    puVar46[3] = uVar45;
    puVar46 = local_2390;
    local_ee8 = local_2390 + 4;
    uVar43 = local_2820._8_8_;
    uVar44 = local_2820._16_8_;
    uVar45 = local_2820._24_8_;
    local_f20 = local_2820._0_8_;
    uStackY_f18 = local_2820._8_8_;
    uStackY_f10 = local_2820._16_8_;
    uStackY_f08 = local_2820._24_8_;
    *local_ee8 = local_2820._0_8_;
    puVar46[5] = uVar43;
    puVar46[6] = uVar44;
    puVar46[7] = uVar45;
    puVar46 = local_2390;
    local_f28 = local_2390 + 8;
    uVar43 = local_2840._8_8_;
    uVar44 = local_2840._16_8_;
    uVar45 = local_2840._24_8_;
    local_f60 = local_2840._0_8_;
    uStackY_f58 = local_2840._8_8_;
    uStackY_f50 = local_2840._16_8_;
    uStackY_f48 = local_2840._24_8_;
    *local_f28 = local_2840._0_8_;
    puVar46[9] = uVar43;
    puVar46[10] = uVar44;
    puVar46[0xb] = uVar45;
    puVar46 = local_2390;
    local_f68 = local_2390 + 0xc;
    uVar43 = local_2860._8_8_;
    uVar44 = local_2860._16_8_;
    uVar45 = local_2860._24_8_;
    local_fa0 = local_2860._0_8_;
    uStackY_f98 = local_2860._8_8_;
    uStackY_f90 = local_2860._16_8_;
    uStackY_f88 = local_2860._24_8_;
    *local_f68 = local_2860._0_8_;
    puVar46[0xd] = uVar43;
    puVar46[0xe] = uVar44;
    puVar46[0xf] = uVar45;
    local_2390 = local_2390 + 0x10;
    local_2904 = local_2904 + 8;
    auVar1 = local_2900;
    auVar2 = auStackY_28f0;
    auVar47._0_16_ = local_2960;
    auVar47._16_16_ = auStackY_2950;
    local_1b00 = auVar41;
    auStackY_1af0 = auVar42;
    local_1b40 = auVar41;
    auStackY_1b30 = auVar42;
    local_1b80 = auVar41;
    auStackY_1b70 = auVar42;
    local_1bc0 = auVar41;
    auStackY_1bb0 = auVar42;
  }
  local_b64 = 0x26002c;
  local_b68 = 0x26002c;
  local_b6c = 0x26002c;
  local_b70 = 0x26002c;
  local_b74 = 0x26002c;
  local_b78 = 0x26002c;
  local_b7c = 0x26002c;
  local_b80 = 0x26002c;
  local_ba4 = 0x90019;
  local_ba8 = 0x90019;
  local_bac = 0x90019;
  local_bb0 = 0x90019;
  local_bb4 = 0x90019;
  local_bb8 = 0x90019;
  local_bbc = 0x90019;
  local_bc0 = 0x90019;
  local_be4 = 0xfff70026;
  local_be8 = 0xfff70026;
  local_bec = 0xfff70026;
  local_bf0 = 0xfff70026;
  local_bf4 = 0xfff70026;
  local_bf8 = 0xfff70026;
  local_bfc = 0xfff70026;
  local_c00 = 0xfff70026;
  local_c24 = 0xffe7ffd4;
  local_c28 = 0xffe7ffd4;
  local_c2c = 0xffe7ffd4;
  local_c30 = 0xffe7ffd4;
  local_c34 = 0xffe7ffd4;
  local_c38 = 0xffe7ffd4;
  local_c3c = 0xffe7ffd4;
  local_c40 = 0xffe7ffd4;
  local_c64 = 0xffd40019;
  local_c68 = 0xffd40019;
  local_c6c = 0xffd40019;
  local_c70 = 0xffd40019;
  local_c74 = 0xffd40019;
  local_c78 = 0xffd40019;
  local_c7c = 0xffd40019;
  local_c80 = 0xffd40019;
  local_ca4 = 0x260009;
  local_ca8 = 0x260009;
  local_cac = 0x260009;
  local_cb0 = 0x260009;
  local_cb4 = 0x260009;
  local_cb8 = 0x260009;
  local_cbc = 0x260009;
  local_cc0 = 0x260009;
  local_ce4 = 0xffe70009;
  local_ce8 = 0xffe70009;
  local_cec = 0xffe70009;
  local_cf0 = 0xffe70009;
  local_cf4 = 0xffe70009;
  local_cf8 = 0xffe70009;
  local_cfc = 0xffe70009;
  local_d00 = 0xffe70009;
  local_d24 = 0xffd40026;
  local_d28 = 0xffd40026;
  local_d2c = 0xffd40026;
  local_d30 = 0xffd40026;
  local_d34 = 0xffd40026;
  local_d38 = 0xffd40026;
  local_d3c = 0xffd40026;
  local_d40 = 0xffd40026;
  local_d64 = 0x200020;
  local_d68 = 0x200020;
  local_d6c = 0x200020;
  local_d70 = 0x200020;
  local_d74 = 0x200020;
  local_d78 = 0x200020;
  local_d7c = 0x200020;
  local_d80 = 0x200020;
  local_da4 = 0xffe00020;
  local_da8 = 0xffe00020;
  local_dac = 0xffe00020;
  local_db0 = 0xffe00020;
  local_db4 = 0xffe00020;
  local_db8 = 0xffe00020;
  local_dbc = 0xffe00020;
  local_dc0 = 0xffe00020;
  local_de4 = 0x11002a;
  local_de8 = 0x11002a;
  local_dec = 0x11002a;
  local_df0 = 0x11002a;
  local_df4 = 0x11002a;
  local_df8 = 0x11002a;
  local_dfc = 0x11002a;
  local_e00 = 0x11002a;
  local_e24 = 0xffd60011;
  local_e28 = 0xffd60011;
  local_e2c = 0xffd60011;
  local_e30 = 0xffd60011;
  local_e34 = 0xffd60011;
  local_e38 = 0xffd60011;
  local_e3c = 0xffd60011;
  local_e40 = 0xffd60011;
  local_e64 = 0x10;
  local_e68 = 0x10;
  local_e6c = 0x10;
  local_e70 = 0x10;
  local_e74 = 0x10;
  local_e78 = 0x10;
  local_e7c = 0x10;
  local_e80 = 0x10;
  local_2960 = auVar47._0_16_;
  auStackY_2950 = auVar47._16_16_;
  dct2_butterfly_h32_avx2
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  return;
}

Assistant:

void itrans_dct2_h8_w32_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 32]);
    dct2_butterfly_h8_avx2(src, 32, tmp, 32, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h32_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}